

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dispatch_profile.c
# Opt level: O0

parasail_profile_t *
parasail_profile_create_64_dispatcher(char *s1,int s1Len,parasail_matrix_t *matrix)

{
  int iVar1;
  parasail_profile_t *ppVar2;
  parasail_matrix_t *matrix_local;
  int s1Len_local;
  char *s1_local;
  
  iVar1 = parasail_can_use_avx2();
  if (iVar1 == 0) {
    iVar1 = parasail_can_use_sse41();
    if ((iVar1 == 0) && (iVar1 = parasail_can_use_sse2(), iVar1 == 0)) {
      return (parasail_profile_t *)0x0;
    }
    parasail_profile_create_64_pointer = parasail_profile_create_sse_128_64;
  }
  else {
    parasail_profile_create_64_pointer = parasail_profile_create_avx_256_64;
  }
  ppVar2 = (*parasail_profile_create_64_pointer)(s1,s1Len,matrix);
  return ppVar2;
}

Assistant:

parasail_profile_t* parasail_profile_create_64_dispatcher(
        const char * const restrict s1, const int s1Len,
        const parasail_matrix_t *matrix)
{
#if HAVE_AVX2
    if (parasail_can_use_avx2()) {
        parasail_profile_create_64_pointer = parasail_profile_create_avx_256_64;
    }
    else
#endif
#if HAVE_SSE41
    if (parasail_can_use_sse41()) {
        parasail_profile_create_64_pointer = parasail_profile_create_sse_128_64;
    }
    else
#endif
#if HAVE_SSE2
    if (parasail_can_use_sse2()) {
        parasail_profile_create_64_pointer = parasail_profile_create_sse_128_64;
    }
    else
#endif
#if HAVE_ALTIVEC
    if (parasail_can_use_altivec()) {
        parasail_profile_create_64_pointer = parasail_profile_create_altivec_128_64;
    }
    else
#endif
#if HAVE_NEON
    if (parasail_can_use_neon()) {
        parasail_profile_create_64_pointer = parasail_profile_create_neon_128_64;
    }
    else
#endif
    {
        /* no fallback; caller must check for non-NULL profile */
        return NULL;
    }
    return parasail_profile_create_64_pointer(s1, s1Len, matrix);
}